

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O1

lzma_ret stream_encoder_update
                   (lzma_coder_conflict2 *coder,lzma_allocator *allocator,lzma_filter *filters,
                   lzma_filter *reversed_filters)

{
  lzma_ret lVar1;
  lzma_filter *plVar2;
  
  if (coder->sequence < SEQ_BLOCK_HEADER) {
    coder->block_encoder_is_initialized = false;
    (coder->block_options).filters = filters;
    lVar1 = block_encoder_init(coder,allocator);
    (coder->block_options).filters = coder->filters;
    if (lVar1 == LZMA_OK) {
      coder->block_encoder_is_initialized = true;
LAB_004edca6:
      if (coder->filters[0].id != 0xffffffffffffffff) {
        plVar2 = coder->filters;
        do {
          plVar2 = plVar2 + 1;
          lzma_free(plVar2[-1].options,allocator);
        } while (plVar2->id != 0xffffffffffffffff);
      }
      lVar1 = lzma_filters_copy(filters,coder->filters,allocator);
      return lVar1;
    }
  }
  else {
    lVar1 = LZMA_PROG_ERROR;
    if (coder->sequence < SEQ_INDEX_ENCODE) {
      lVar1 = (*(coder->block_encoder).update)
                        ((coder->block_encoder).coder,allocator,filters,reversed_filters);
      if (lVar1 == LZMA_OK) goto LAB_004edca6;
    }
  }
  return lVar1;
}

Assistant:

static lzma_ret
stream_encoder_update(lzma_coder *coder, lzma_allocator *allocator,
		const lzma_filter *filters,
		const lzma_filter *reversed_filters)
{
	size_t i;

	if (coder->sequence <= SEQ_BLOCK_INIT) {
		lzma_ret ret;

		// There is no incomplete Block waiting to be finished,
		// thus we can change the whole filter chain. Start by
		// trying to initialize the Block encoder with the new
		// chain. This way we detect if the chain is valid.
		coder->block_encoder_is_initialized = false;
		coder->block_options.filters = (lzma_filter *)(filters);
		ret = block_encoder_init(coder, allocator);
		coder->block_options.filters = coder->filters;
		if (ret != LZMA_OK)
			return ret;

		coder->block_encoder_is_initialized = true;

	} else if (coder->sequence <= SEQ_BLOCK_ENCODE) {
		// We are in the middle of a Block. Try to update only
		// the filter-specific options.
		return_if_error(coder->block_encoder.update(
				coder->block_encoder.coder, allocator,
				filters, reversed_filters));
	} else {
		// Trying to update the filter chain when we are already
		// encoding Index or Stream Footer.
		return LZMA_PROG_ERROR;
	}

	// Free the copy of the old chain and make a copy of the new chain.
	for (i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	return lzma_filters_copy(filters, coder->filters, allocator);
}